

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderPrimitiveCoverage.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderPrimitiveCoverage::drawPatch
          (TessellationShaderPrimitiveCoverage *this,GLuint po_id,GLuint n_patch_vertices,
          GLuint n_draw_call_vertices,GLfloat *inner_levels,GLfloat *outer_levels)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 extraout_var;
  long lVar5;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar5 + 0x1680))(po_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glUseProgram() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x24a);
  uVar3 = (**(code **)(lVar5 + 0xb48))(po_id,"innerLevel");
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetUniformLocation() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x251);
  uVar4 = (**(code **)(lVar5 + 0xb48))(po_id,"outerLevel");
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetUniformLocation() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x254);
  (**(code **)(lVar5 + 0x1528))(uVar3,1,inner_levels);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glUniform2fv() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,599);
  (**(code **)(lVar5 + 0x15a8))(uVar4,1,outer_levels);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glUniform4fv() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x25a);
  (**(code **)(lVar5 + 0xfd8))
            ((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,n_patch_vertices);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glPatchParameteriEXT() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x25d);
  (**(code **)(lVar5 + 0x1c0))(0x3f800000,0x3f008081,0x3e808081,0x3e008081);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glClearColor() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x264);
  uVar3 = (**(code **)(lVar5 + 0xb48))(po_id,"stencil_fail_color");
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetUniformLocation() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x26a);
  (**(code **)(lVar5 + 0x15a8))(uVar3,1,m_stencil_pass_color);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glUniform4fv() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x26d);
  (**(code **)(lVar5 + 0x208))(0);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glClearStencil() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x271);
  (**(code **)(lVar5 + 0x188))(0x4400);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glClear() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x274);
  (**(code **)(lVar5 + 0x12e8))(0x1e01,0x1e00,0x1e00);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glStencilOp() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x277);
  (**(code **)(lVar5 + 0x12c8))(0x200,1,0xff);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glStencilFunc() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x27a);
  (**(code **)(lVar5 + 0x538))((this->super_TestCaseBase).m_glExtTokens.PATCHES,0,n_patch_vertices);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glDrawArrays() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x27d);
  (**(code **)(lVar5 + 0x1680))(this->m_stencil_verification_po_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glUseProgram() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x286);
  uVar3 = (**(code **)(lVar5 + 0xb48))(this->m_stencil_verification_po_id,"stencil_fail_color");
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetUniformLocation() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x28b);
  (**(code **)(lVar5 + 0x15a8))(uVar3,1,m_stencil_pass_color);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glUniform4fv() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x28e);
  (**(code **)(lVar5 + 0x12e8))(0x1e00,0x1e00,0x1e00);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glStencilOp() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x292);
  (**(code **)(lVar5 + 0x12c8))(0x205,1,0xff);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glStencilFunc() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x295);
  (**(code **)(lVar5 + 0x538))(4,0,n_draw_call_vertices);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glDrawArrays() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x298);
  return;
}

Assistant:

void TessellationShaderPrimitiveCoverage::drawPatch(glw::GLuint po_id, glw::GLuint n_patch_vertices,
													glw::GLuint n_draw_call_vertices, const glw::GLfloat inner_levels[],
													const glw::GLfloat outer_levels[])
{
	/* Sanity check */
	DE_ASSERT(n_draw_call_vertices == 3 || n_draw_call_vertices == 6);

	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Activate user-provided program object with tessellation stage defined*/
	gl.useProgram(po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed!");

	/* Set up tessellation levels */
	glw::GLint innerLevelUniformLocation = -1;
	glw::GLint outerLevelUniformLocation = -1;

	innerLevelUniformLocation = gl.getUniformLocation(po_id, "innerLevel");
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformLocation() failed!");

	outerLevelUniformLocation = gl.getUniformLocation(po_id, "outerLevel");
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformLocation() failed!");

	gl.uniform2fv(innerLevelUniformLocation, 1 /* count */, inner_levels);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform2fv() failed!");

	gl.uniform4fv(outerLevelUniformLocation, 1 /* count */, outer_levels);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform4fv() failed!");

	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, n_patch_vertices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() failed!");

	/* Set up clear color */
	gl.clearColor(m_clear_color[0],  /* red */
				  m_clear_color[1],  /* green */
				  m_clear_color[2],  /* blue */
				  m_clear_color[3]); /* alpha */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor() failed!");

	/* Set up fragment color to be used for the first stage */
	glw::GLint stencilPassColorUniformLocation = -1;

	stencilPassColorUniformLocation = gl.getUniformLocation(po_id, "stencil_fail_color");
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformLocation() failed!");

	gl.uniform4fv(stencilPassColorUniformLocation, 1, m_stencil_pass_color);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform4fv() failed!");

	/* Draw to stencil buffer */
	gl.clearStencil(0 /* s */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearStencil() failed!");

	gl.clear(GL_COLOR_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClear() failed!");

	gl.stencilOp(GL_REPLACE /* sfail */, GL_KEEP /* dpfail */, GL_KEEP /* dppass */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glStencilOp() failed!");

	gl.stencilFunc(GL_NEVER /* func */, 1 /* ref */, 0xFF /* mask */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glStencilFunc() failed!");

	gl.drawArrays(m_glExtTokens.PATCHES, 0 /* first */, n_patch_vertices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed");

	/* Now verify the stencil buffer data contents by doing another
	 * full-screen draw call. This time without any tessellation.
	 * The pass will output fragments of predefined color, if stencil
	 * test passes (which will only happen if the stencil buffer is
	 * not filled with predefined index value).
	 */
	gl.useProgram(m_stencil_verification_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed!");

	/* Color setup for 2nd program*/
	stencilPassColorUniformLocation = gl.getUniformLocation(m_stencil_verification_po_id, "stencil_fail_color");

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformLocation() failed!");

	gl.uniform4fv(stencilPassColorUniformLocation, 1 /* count */, m_stencil_pass_color);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform4fv() failed!");

	/* Draw to framebuffer */
	gl.stencilOp(GL_KEEP /* sfail */, GL_KEEP /* dpfail */, GL_KEEP /* dppass */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glStencilOp() failed!");

	gl.stencilFunc(GL_NOTEQUAL /* func */, 1 /* ref */, 0xFF /* mask */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glStencilFunc() failed!");

	gl.drawArrays(GL_TRIANGLES, 0 /* first */, n_draw_call_vertices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed");
}